

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O3

void addCategoricalCrossEntropyLoss<CoreML::Specification::NeuralNetworkClassifier>
               (Model *m,NeuralNetworkClassifier *nn,char *lossName,char *softmaxInputName,
               char *targetName)

{
  string *psVar1;
  NetworkUpdateParameters *this;
  Type *this_00;
  CategoricalCrossEntropyLossLayer *this_01;
  ModelDescription *this_02;
  Type *pTVar2;
  FeatureType *this_03;
  ArrayFeatureType *this_04;
  int iVar3;
  
  this = nn->updateparams_;
  if (this == (NetworkUpdateParameters *)0x0) {
    this = (NetworkUpdateParameters *)operator_new(0x50);
    CoreML::Specification::NetworkUpdateParameters::NetworkUpdateParameters(this);
    nn->updateparams_ = this;
  }
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                      (&(this->losslayers_).super_RepeatedPtrFieldBase,(Type *)0x0);
  CoreML::Specification::LossLayer::set_name(this_00,lossName);
  if (this_00->_oneof_case_[0] == 10) {
    this_01 = (this_00->LossLayerType_).categoricalcrossentropylosslayer_;
  }
  else {
    CoreML::Specification::LossLayer::clear_LossLayerType(this_00);
    this_00->_oneof_case_[0] = 10;
    this_01 = (CategoricalCrossEntropyLossLayer *)operator_new(0x28);
    CoreML::Specification::CategoricalCrossEntropyLossLayer::CategoricalCrossEntropyLossLayer
              (this_01);
    (this_00->LossLayerType_).categoricalcrossentropylosslayer_ = this_01;
  }
  CoreML::Specification::CategoricalCrossEntropyLossLayer::set_input(this_01,softmaxInputName);
  CoreML::Specification::CategoricalCrossEntropyLossLayer::set_target(this_01,targetName);
  this_02 = m->description_;
  if (this_02 == (ModelDescription *)0x0) {
    this_02 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(this_02);
    m->description_ = this_02;
  }
  pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(this_02->traininginput_).super_RepeatedPtrFieldBase,(Type *)0x0);
  psVar1 = (pTVar2->name_).ptr_;
  if (psVar1 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&pTVar2->name_,(this_01->target_).ptr_);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar1);
  }
  this_03 = pTVar2->type_;
  if (this_03 == (FeatureType *)0x0) {
    this_03 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(this_03);
    pTVar2->type_ = this_03;
  }
  if (this_03->_oneof_case_[0] == 5) {
    this_04 = (this_03->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(this_03);
    this_03->_oneof_case_[0] = 5;
    this_04 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(this_04);
    (this_03->Type_).multiarraytype_ = this_04;
  }
  this_04->datatype_ = 0x20020;
  iVar3 = (this_04->shape_).current_size_;
  if (iVar3 == (this_04->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&this_04->shape_,iVar3 + 1);
    iVar3 = (this_04->shape_).current_size_;
  }
  (this_04->shape_).current_size_ = iVar3 + 1;
  ((this_04->shape_).rep_)->elements[iVar3] = 1;
  return;
}

Assistant:

void addCategoricalCrossEntropyLoss(Specification::Model& m, NeuralNetworkClass *nn, const char *lossName, const char *softmaxInputName, const char *targetName) {

    Specification::NetworkUpdateParameters *updateParams = nn->mutable_updateparams();
    Specification::LossLayer *lossLayer = updateParams->add_losslayers();
    lossLayer->set_name(lossName);
    Specification::CategoricalCrossEntropyLossLayer *ceLossLayer = lossLayer->mutable_categoricalcrossentropylosslayer();
    ceLossLayer->set_input(softmaxInputName);
    ceLossLayer->set_target(targetName);

    auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
    trainingInput->set_name(ceLossLayer->target());
    auto trainingInputTensorShape = trainingInput->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

}